

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

int QRsol(int n,realtype **h,realtype *q,realtype *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int code;
  int q_ptr;
  int k;
  int i;
  realtype temp2;
  realtype temp1;
  realtype s;
  realtype c;
  realtype *b_local;
  realtype *q_local;
  realtype **h_local;
  int n_local;
  
  for (code = 0; code < n; code = code + 1) {
    dVar1 = q[code * 2];
    dVar2 = q[code * 2 + 1];
    dVar3 = b[code];
    b[code] = dVar1 * dVar3 + -(dVar2 * b[code + 1]);
    b[code + 1] = dVar2 * dVar3 + dVar1 * b[code + 1];
  }
  code = n + -1;
  while( true ) {
    if (code < 0) {
      return 0;
    }
    if ((h[code][code] == 0.0) && (!NAN(h[code][code]))) break;
    b[code] = b[code] / h[code][code];
    for (q_ptr = 0; q_ptr < code; q_ptr = q_ptr + 1) {
      b[q_ptr] = -b[code] * h[q_ptr][code] + b[q_ptr];
    }
    code = code + -1;
  }
  return code + 1;
}

Assistant:

int QRsol(int n, realtype **h, realtype *q, realtype *b)
{
  realtype c, s, temp1, temp2;
  int i, k, q_ptr, code=0;

  /* Compute Q*b */
  
  for (k=0; k < n; k++) {
    q_ptr = 2*k;
    c = q[q_ptr];
    s = q[q_ptr+1];
    temp1 = b[k];
    temp2 = b[k+1];
    b[k] = c*temp1 - s*temp2;
    b[k+1] = s*temp1 + c*temp2;
  }

  /* Solve  R*x = Q*b */

  for (k=n-1; k >= 0; k--) {
    if (h[k][k] == ZERO) {
      code = k + 1;
      break;
    }
    b[k] /= h[k][k];
    for (i=0; i < k; i++) b[i] -= b[k]*h[i][k];
  }
  
  return (code);
}